

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

ExprArgWriter __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::ExprWriter::OPutN
          (ExprWriter *this,int opcode,int nArgs,char *descr)

{
  uint uVar1;
  undefined8 extraout_RDX;
  uint uVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  ExprArgWriter EVar4;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,opcode);
  TextFormatter::apr((TextFormatter *)*puVar3,(File *)&((TextFormatter *)*puVar3)[0x13].nl_comments,
                     "o%d\t#%s\n",(ulong)(uint)nArgs);
  uVar2 = (uint)descr;
  uVar1 = (uint)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | (ulong)descr & 0xffffffff) / 2);
  if (nArgs != 0x40) {
    uVar1 = uVar2;
  }
  TextFormatter::apr((TextFormatter *)*puVar3,(File *)&((TextFormatter *)*puVar3)[0x13].nl_comments,
                     "%d\n",(ulong)uVar1);
  this->nlw_ = (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)*puVar3;
  *(uint *)&this[1].nlw_ = uVar2;
  EVar4._8_8_ = extraout_RDX;
  EVar4.nlw_ = (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)this;
  return EVar4;
}

Assistant:

typename NLWriter2<Params>::ExprArgWriter
NLWriter2<Params>::ExprWriter::OPutN(
    int opcode, int nArgs, const char* descr) {
  nlw_.apr(nlw_.nm,
           "o%d\t#%s\n", opcode, descr);
  int n2write = nArgs;
  if (64 == opcode) {       // piecewise-linear
    assert(0 == n2write % 2);
    n2write /= 2;
  }
  nlw_.apr(nlw_.nm, "%d\n", n2write);
  return ExprArgWriter(nlw_, nArgs);
}